

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack28(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x1c | (uint)*in & 0xfffffff;
  out[1] = (uint)uVar1 >> 4 & 0xffffff;
  Unroller<(unsigned_short)28,_(unsigned_short)2>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack28(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<28>::Pack(in, out);
}